

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test::TestBody
          (UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test *this)

{
  float fVar1;
  bool bVar2;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar3;
  char *pcVar4;
  long lVar5;
  Index IVar6;
  Scalar *pSVar7;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i;
  Message local_2c0;
  Index local_2b8;
  Index local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_290;
  Message local_288;
  Index local_280;
  Index local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar;
  template_SigmaPoints<Vector<T,_2>_> points;
  undefined1 local_210 [8];
  Matrix<T,_2,_7> ref;
  Matrix<float,2,7,0,2,7> local_1a4 [8];
  Matrix<T,_2,_7> tmp;
  Scalar local_164;
  Scalar local_160;
  Scalar local_15c;
  Scalar local_158;
  Scalar local_154;
  Scalar local_150;
  Scalar local_14c;
  Scalar local_148;
  Scalar local_144;
  Scalar local_140;
  Scalar local_13c;
  Scalar local_138;
  Scalar local_134;
  Scalar local_130;
  Scalar local_12c;
  Scalar local_128;
  Scalar local_124;
  Scalar local_120 [5];
  Scalar local_10c;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> local_108;
  undefined1 auStack_e8 [8];
  QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_> model;
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  UnscentedKalmanFilterBase_computeSigmaPointMeasurements_Test *this_local;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
  ConcreteUKF<Kalman::Vector<float,_3>_>::ConcreteUKF
            ((ConcreteUKF<Kalman::Vector<float,_3>_> *)
             ((long)&model.
                     super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>
                     .super_StandardBase<Kalman::Vector<float,_2>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data +
             8),1.0,2.0,1.0);
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  _8_8_ = 0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  super_StandardBase<Kalman::Vector<float,_2>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  super_StandardBase<Kalman::Vector<float,_2>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  auStack_e8 = (undefined1  [8])0x0;
  model.
  super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>.
  _vptr_MeasurementModel = (_func_int **)0x0;
  Kalman::Test::Models::
  QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_>::
  QuadraticMeasurementModel
            ((QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_> *)
             auStack_e8);
  local_10c = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator<<
            (&local_108,
             (DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14),&local_10c);
  local_120[0] = 2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (&local_108,local_120);
  local_124 = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_124);
  local_128 = 4.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_128);
  local_12c = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_12c);
  local_130 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_130);
  local_134 = 7.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_134);
  local_138 = 8.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_138);
  local_13c = 9.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_13c);
  local_140 = 10.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_140);
  local_144 = 11.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_144);
  local_148 = 12.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_148);
  local_14c = 13.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_14c);
  local_150 = 14.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_150);
  local_154 = 15.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_154);
  local_158 = 16.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_158);
  local_15c = 17.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_15c);
  local_160 = 18.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_160);
  local_164 = 19.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,&local_164);
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xd] = 20.0
  ;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                     (pCVar3,tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                             m_storage.m_data.array + 0xd);
  tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0xc] = 21.0
  ;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
            (pCVar3,tmp.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data
                    .array + 0xc);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::~CommaInitializer(&local_108);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::topRows<2>
            ((Type *)(ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                      m_data.array + 0xc),
             (DenseBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)
             ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
                     super_Matrix<float,_7,_1>.
                     super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data +
             0x14),2);
  Eigen::Matrix<float,2,7,0,2,7>::Matrix<Eigen::Block<Eigen::Matrix<float,3,7,0,3,7>,2,7,false>>
            (local_1a4,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_2,_7,_false>_> *)
             (ref.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
             + 0xc));
  Eigen::MatrixBase<Eigen::Matrix<float,2,7,0,2,7>>::cwiseProduct<Eigen::Matrix<float,2,7,0,2,7>>
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
              *)(points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data
                 .array + 0xc),(MatrixBase<Eigen::Matrix<float,2,7,0,2,7>> *)local_1a4,
             (MatrixBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_1a4);
  Eigen::
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>_>_>
  ::eval((EvalReturnType *)local_210,
         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>,_const_Eigen::Matrix<float,_2,_7,_0,_2,_7>_>_>
          *)(points.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
             array + 0xc));
  Eigen::Matrix<float,_2,_7,_0,_2,_7>::Matrix((Matrix<float,_2,_7,_0,_2,_7> *)&gtest_ar.message_);
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::
  computeSigmaPointMeasurements<Kalman::Vector<float,_2>,_Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)
             ((long)&model.
                     super_MeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>,_Kalman::StandardBase>
                     .super_StandardBase<Kalman::Vector<float,_2>_>.P.
                     super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data +
             8),(MeasurementModelType<Kalman::Vector<float,_2>,_Kalman::StandardBase> *)auStack_e8,
             (SigmaPoints<Kalman::Vector<float,_2>_> *)&gtest_ar.message_);
  local_278 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_210);
  local_280 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)&gtest_ar.message_
                        );
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_270,"ref.rows()","points.rows()",&local_278,&local_280);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_2b0 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_210);
    local_2b8 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)
                           &gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<long,long>
              ((EqHelper<false> *)local_2a8,"ref.cols()","points.cols()",&local_2b0,&local_2b8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar2) {
      testing::Message::Message(&local_2c0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&j,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                 ,0x61,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&j,&local_2c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j);
      testing::Message::~Message(&local_2c0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      for (gtest_ar_2.message_.ptr_._4_4_ = 0; lVar5 = (long)gtest_ar_2.message_.ptr_._4_4_,
          IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_210),
          lVar5 < IVar6; gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
        for (gtest_ar_2.message_.ptr_._0_4_ = 0; lVar5 = (long)(int)gtest_ar_2.message_.ptr_,
            IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)local_210),
            lVar5 < IVar6; gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1) {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1> *)local_210,
                              (long)gtest_ar_2.message_.ptr_._4_4_,
                              (long)(int)gtest_ar_2.message_.ptr_);
          fVar1 = *pSVar7;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>,_1> *)
                              &gtest_ar.message_,(long)gtest_ar_2.message_.ptr_._4_4_,
                              (long)(int)gtest_ar_2.message_.ptr_);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_2e0,"ref(i,j)","points(i,j)","1e-10",(double)fVar1,
                     (double)*pSVar7,1e-10);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
          if (!bVar2) {
            testing::Message::Message(&local_2e8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                       ,0x61,pcVar4);
            testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
            testing::internal::AssertHelper::~AssertHelper(&local_2f0);
            testing::Message::~Message(&local_2e8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
          if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_0036943a;
        }
      }
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
LAB_0036943a:
  Kalman::Test::Models::
  QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_>::
  ~QuadraticMeasurementModel
            ((QuadraticMeasurementModel<Kalman::Vector<float,_3>,_Kalman::Vector<float,_2>_> *)
             auStack_e8);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computeSigmaPointMeasurements) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    auto model = Kalman::Test::Models::QuadraticMeasurementModel<Vector<T, 3>, Vector<T, 2>>();
    
    // Init variables
    ukf.sigmaStatePoints <<
         1,  2,  3,  4,  5,  6,  7,
         8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21;
    
    // Compute Reference result
    Matrix<T,2,7> tmp = ukf.sigmaStatePoints.template topRows<2>();
    Matrix<T,2,7> ref = tmp.cwiseProduct(tmp).eval();
    
    typename ConcreteUKF<Vector<T,3>>::template SigmaPoints<Vector<T,2>> points;
    
    ukf.computeSigmaPointMeasurements(model, points);
    
    // Compare ref and result
    ASSERT_MATRIX_NEAR(ref, points, 1e-10);
}